

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_include.c
# Opt level: O3

void emulate_arith3(int code,reg_type *dest,reg_type *src1,reg_type *src2)

{
  uint uVar1;
  float fVar2;
  anon_union_8_11_4e3cf189_for_u aVar3;
  
  switch(code) {
  case 0:
  case 1:
    uVar1 = (src2->u).i.i + (src1->u).i.i;
    goto LAB_00113ee8;
  case 2:
  case 3:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((long)src2->u + (long)src1->u);
    break;
  case 4:
  case 5:
    uVar1 = (src1->u).i.i - *(int *)&src2->u;
    goto LAB_00113ee8;
  case 6:
  case 7:
  case 0x29:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u - (long)src2->u);
    break;
  case 8:
  case 9:
    uVar1 = *(int *)&src2->u * *(int *)&src1->u;
    goto LAB_00113ee8;
  case 10:
  case 0xb:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((long)src2->u * (long)src1->u);
    break;
  case 0xc:
    uVar1 = *(int *)&src1->u / *(int *)&src2->u;
    goto LAB_00113ee8;
  case 0xd:
    uVar1 = *(uint *)&src1->u / *(uint *)&src2->u;
    goto LAB_00113ee8;
  case 0xe:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u / (ulong)src2->u);
    break;
  case 0xf:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u / (long)src2->u);
    break;
  case 0x10:
    uVar1 = *(int *)&src1->u % *(int *)&src2->u;
    goto LAB_00113eb0;
  case 0x11:
    uVar1 = *(uint *)&src1->u % *(uint *)&src2->u;
LAB_00113eb0:
    *(uint *)&dest->u = uVar1;
    return;
  case 0x12:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u % (ulong)src2->u);
    goto LAB_00113ede;
  case 0x13:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u % (long)src2->u);
LAB_00113ede:
    dest->u = aVar3;
    return;
  case 0x14:
  case 0x15:
    uVar1 = (src2->u).i.i ^ (src1->u).i.i;
    goto LAB_00113ee8;
  case 0x16:
  case 0x17:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((ulong)src2->u ^ (ulong)src1->u);
    break;
  case 0x18:
  case 0x19:
    uVar1 = (src2->u).i.i & (src1->u).i.i;
    goto LAB_00113ee8;
  case 0x1a:
  case 0x1b:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((ulong)src2->u & (ulong)src1->u);
    break;
  case 0x1c:
  case 0x1d:
    uVar1 = (src2->u).i.i | (src1->u).i.i;
    goto LAB_00113ee8;
  case 0x1e:
  case 0x1f:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((ulong)src2->u | (ulong)src1->u);
    break;
  case 0x20:
  case 0x21:
    uVar1 = (src1->u).i.i << ((src2->u).c.c & 0x1fU);
    goto LAB_00113ee8;
  case 0x22:
  case 0x23:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u << ((src2->u).c.c & 0x3fU));
    break;
  case 0x24:
    uVar1 = (src1->u).i.i >> ((src2->u).c.c & 0x1fU);
    goto LAB_00113ee8;
  case 0x25:
    uVar1 = (uint)(src1->u).i.i >> ((src2->u).c.c & 0x1fU);
LAB_00113ee8:
    (dest->u).i.i = uVar1;
    return;
  case 0x26:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u >> ((src2->u).c.c & 0x3fU));
    break;
  case 0x27:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u >> ((src2->u).c.c & 0x3fU));
    break;
  case 0x28:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u + (long)src2->u);
    break;
  case 0x2a:
    fVar2 = *(float *)&src1->u + *(float *)&src2->u;
    goto LAB_00113ef3;
  case 0x2b:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((double)src1->u + (double)src2->u);
    goto LAB_00113ebb;
  case 0x2c:
    fVar2 = *(float *)&src1->u - *(float *)&src2->u;
    goto LAB_00113ef3;
  case 0x2d:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((double)src1->u - (double)src2->u);
    goto LAB_00113ebb;
  case 0x2e:
    fVar2 = *(float *)&src1->u * *(float *)&src2->u;
    goto LAB_00113ef3;
  case 0x2f:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((double)src1->u * (double)src2->u);
    goto LAB_00113ebb;
  case 0x30:
    fVar2 = *(float *)&src1->u / *(float *)&src2->u;
LAB_00113ef3:
    *(float *)&dest->u = fVar2;
    return;
  case 0x31:
    aVar3 = (anon_union_8_11_4e3cf189_for_u)((double)src1->u / (double)src2->u);
LAB_00113ebb:
    dest->u = aVar3;
switchD_00113d81_default:
    return;
  default:
    goto switchD_00113d81_default;
  }
  dest->u = aVar3;
  return;
}

Assistant:

void emulate_arith3(int code, struct reg_type *dest, struct reg_type *src1, struct reg_type *src2)
{
    switch(code) {
	  case dill_jmp_addi:  dest->u.i.i =  src1->u.i.i +  src2->u.i.i; break;
	  case dill_jmp_addu:  dest->u.u.u =  src1->u.u.u +  src2->u.u.u; break;
	  case dill_jmp_addul:  dest->u.ul.ul =  src1->u.ul.ul +  src2->u.ul.ul; break;
	  case dill_jmp_addl:  dest->u.l.l =  src1->u.l.l +  src2->u.l.l; break;
	  case dill_jmp_addp:  dest->u.p.p = (char*) src1->u.p.p + (IMM_TYPE) src2->u.p.p; break;
	  case dill_jmp_subi:  dest->u.i.i =  src1->u.i.i -  src2->u.i.i; break;
	  case dill_jmp_subu:  dest->u.u.u =  src1->u.u.u -  src2->u.u.u; break;
	  case dill_jmp_subul:  dest->u.ul.ul =  src1->u.ul.ul -  src2->u.ul.ul; break;
	  case dill_jmp_subl:  dest->u.l.l =  src1->u.l.l -  src2->u.l.l; break;
	  case dill_jmp_subp:  dest->u.p.p = (char*) src1->u.p.p - (IMM_TYPE) src2->u.p.p; break;
	  case dill_jmp_mulu:  dest->u.u.u =  src1->u.u.u *  src2->u.u.u; break;
	  case dill_jmp_mulul:  dest->u.ul.ul =  src1->u.ul.ul *  src2->u.ul.ul; break;
	  case dill_jmp_muli:  dest->u.i.i =  src1->u.i.i *  src2->u.i.i; break;
	  case dill_jmp_mull:  dest->u.l.l =  src1->u.l.l *  src2->u.l.l; break;
	  case dill_jmp_divu:  dest->u.u.u =  src1->u.u.u /  src2->u.u.u; break;
	  case dill_jmp_divul:  dest->u.ul.ul =  src1->u.ul.ul /  src2->u.ul.ul; break;
	  case dill_jmp_divi:  dest->u.i.i =  src1->u.i.i /  src2->u.i.i; break;
	  case dill_jmp_divl:  dest->u.l.l =  src1->u.l.l /  src2->u.l.l; break;
	  case dill_jmp_modu:  dest->u.u.u =  src1->u.u.u %  src2->u.u.u; break;
	  case dill_jmp_modul:  dest->u.ul.ul =  src1->u.ul.ul %  src2->u.ul.ul; break;
	  case dill_jmp_modi:  dest->u.i.i =  src1->u.i.i %  src2->u.i.i; break;
	  case dill_jmp_modl:  dest->u.l.l =  src1->u.l.l %  src2->u.l.l; break;
	  case dill_jmp_andu:  dest->u.u.u =  src1->u.u.u &  src2->u.u.u; break;
	  case dill_jmp_andul:  dest->u.ul.ul =  src1->u.ul.ul &  src2->u.ul.ul; break;
	  case dill_jmp_andi:  dest->u.i.i =  src1->u.i.i &  src2->u.i.i; break;
	  case dill_jmp_andl:  dest->u.l.l =  src1->u.l.l &  src2->u.l.l; break;
	  case dill_jmp_oru:  dest->u.u.u =  src1->u.u.u |  src2->u.u.u; break;
	  case dill_jmp_orul:  dest->u.ul.ul =  src1->u.ul.ul |  src2->u.ul.ul; break;
	  case dill_jmp_ori:  dest->u.i.i =  src1->u.i.i |  src2->u.i.i; break;
	  case dill_jmp_orl:  dest->u.l.l =  src1->u.l.l |  src2->u.l.l; break;
	  case dill_jmp_xoru:  dest->u.u.u =  src1->u.u.u ^  src2->u.u.u; break;
	  case dill_jmp_xorul:  dest->u.ul.ul =  src1->u.ul.ul ^  src2->u.ul.ul; break;
	  case dill_jmp_xori:  dest->u.i.i =  src1->u.i.i ^  src2->u.i.i; break;
	  case dill_jmp_xorl:  dest->u.l.l =  src1->u.l.l ^  src2->u.l.l; break;
	  case dill_jmp_lshu:  dest->u.u.u =  src1->u.u.u <<  src2->u.u.u; break;
	  case dill_jmp_lshul:  dest->u.ul.ul =  src1->u.ul.ul <<  src2->u.ul.ul; break;
	  case dill_jmp_lshi:  dest->u.i.i =  src1->u.i.i <<  src2->u.i.i; break;
	  case dill_jmp_lshl:  dest->u.l.l =  src1->u.l.l <<  src2->u.l.l; break;
	  case dill_jmp_rshu:  dest->u.u.u =  src1->u.u.u >>  src2->u.u.u; break;
	  case dill_jmp_rshul:  dest->u.ul.ul =  src1->u.ul.ul >>  src2->u.ul.ul; break;
	  case dill_jmp_rshi:  dest->u.i.i =  src1->u.i.i >>  src2->u.i.i; break;
	  case dill_jmp_rshl:  dest->u.l.l =  src1->u.l.l >>  src2->u.l.l; break;
	  case dill_jmp_addf:  dest->u.f.f =  src1->u.f.f +  src2->u.f.f; break;
	  case dill_jmp_addd:  dest->u.d.d =  src1->u.d.d +  src2->u.d.d; break;
	  case dill_jmp_subf:  dest->u.f.f =  src1->u.f.f -  src2->u.f.f; break;
	  case dill_jmp_subd:  dest->u.d.d =  src1->u.d.d -  src2->u.d.d; break;
	  case dill_jmp_mulf:  dest->u.f.f =  src1->u.f.f *  src2->u.f.f; break;
	  case dill_jmp_muld:  dest->u.d.d =  src1->u.d.d *  src2->u.d.d; break;
	  case dill_jmp_divf:  dest->u.f.f =  src1->u.f.f /  src2->u.f.f; break;
	  case dill_jmp_divd:  dest->u.d.d =  src1->u.d.d /  src2->u.d.d; break;
    }
}